

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetQueue.h
# Opt level: O2

void __thiscall
dg::ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push
          (SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *this,ValueType *what)

{
  pair<std::_Rb_tree_iterator<const_llvm::Function_*>,_bool> pVar1;
  
  pVar1 = std::
          _Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
          ::_M_insert_unique<llvm::Function_const*const&>
                    ((_Rb_tree<llvm::Function_const*,llvm::Function_const*,std::_Identity<llvm::Function_const*>,std::less<llvm::Function_const*>,std::allocator<llvm::Function_const*>>
                      *)this,what);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::deque<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              ((deque<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
               &this->_queue,what);
    return;
  }
  return;
}

Assistant:

void push(const ValueType &what) {
        if (_queued.insert(what).second)
            _queue.push(what);
    }